

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O3

DrawMethod __thiscall
de::Random::
chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod*,float_const*>
          (Random *this,DrawMethod *first,DrawMethod *last,float *weight)

{
  int iVar1;
  DrawMethod *pDVar2;
  DrawMethod *pDVar3;
  long lVar4;
  DrawMethod *pDVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pDVar3 = last;
  if (first == last) {
    deRandom_getFloat(&this->m_rnd);
  }
  else {
    fVar6 = 0.0;
    iVar1 = 1;
    lVar4 = 0;
    do {
      fVar6 = fVar6 + weight[lVar4];
      lVar4 = (long)iVar1;
      iVar1 = iVar1 + 1;
    } while (first + lVar4 != last);
    fVar7 = deRandom_getFloat(&this->m_rnd);
    if (first != last) {
      iVar1 = 1;
      lVar4 = 0;
      fVar8 = 0.0;
      pDVar2 = last;
      pDVar5 = first;
      do {
        fVar8 = fVar8 + weight[lVar4];
        pDVar3 = pDVar5;
        if (fVar6 * fVar7 + 0.0 < fVar8) break;
        if (0.0 < weight[lVar4]) {
          pDVar2 = pDVar5;
        }
        lVar4 = (long)iVar1;
        pDVar5 = first + lVar4;
        iVar1 = iVar1 + 1;
        pDVar3 = pDVar2;
      } while (pDVar5 != last);
    }
  }
  return *pDVar3;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}